

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSByteGetterSuffix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BytesMode bytes_mode)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if ((int)this == 2) {
    pcVar2 = "U8";
    paVar1 = &local_b;
  }
  else if ((int)this == 1) {
    pcVar2 = "B64";
    paVar1 = &local_a;
  }
  else {
    pcVar2 = "";
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string JSByteGetterSuffix(BytesMode bytes_mode) {
  switch (bytes_mode) {
    case BYTES_DEFAULT:
      return "";
    case BYTES_B64:
      return "B64";
    case BYTES_U8:
      return "U8";
    default:
      assert(false);
  }
  return "";
}